

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckBlockSignature
          (SharedValidator *this,Location *loc,Opcode opcode,Type sig_type,
          TypeVector *out_param_types,TypeVector *out_result_types)

{
  pointer pTVar1;
  Result RVar2;
  Result RVar3;
  Enum EVar4;
  bool bVar5;
  FuncType func_type;
  Type local_f0;
  Opcode local_ec;
  Location *local_e8;
  TypeVector *local_e0;
  FuncType local_d8;
  TypeVector local_a8 [2];
  Var local_78;
  
  local_f0.enum_ = sig_type.enum_;
  local_ec.enum_ = opcode.enum_;
  if (sig_type.enum_ < Any) {
    pTVar1 = (out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar1) {
      (out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    Type::GetInlineVector(local_a8,&local_f0);
    pTVar1 = (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl
             .super__Vector_impl_data._M_start;
    (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_start;
    (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pTVar1 != (pointer)0x0) {
      operator_delete(pTVar1);
      if (local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    EVar4 = Ok;
  }
  else {
    local_d8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8 = loc;
    local_e0 = out_result_types;
    Var::Var(&local_78,sig_type.enum_,loc);
    RVar2 = CheckFuncTypeIndex(this,&local_78,&local_d8);
    bVar5 = RVar2.enum_ == Error;
    Var::~Var(&local_78);
    if ((local_d8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_d8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((this->options_).features.multi_value_enabled_ == false)) {
      Opcode::GetInfo(&local_ec);
      RVar3 = PrintError(this,local_e8,"%s params not currently supported.",
                         local_a8[0].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      bVar5 = RVar3.enum_ == Error || RVar2.enum_ == Error;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (out_param_types,&local_d8.params);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(local_e0,&local_d8.results);
    if (local_d8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    EVar4 = (Enum)bVar5;
  }
  return (Result)EVar4;
}

Assistant:

Result SharedValidator::CheckBlockSignature(const Location& loc,
                                            Opcode opcode,
                                            Type sig_type,
                                            TypeVector* out_param_types,
                                            TypeVector* out_result_types) {
  Result result = Result::Ok;

  if (sig_type.IsIndex()) {
    Index sig_index = sig_type.GetIndex();
    FuncType func_type;
    result |= CheckFuncTypeIndex(Var(sig_index, loc), &func_type);

    if (!func_type.params.empty() && !options_.features.multi_value_enabled()) {
      result |= PrintError(loc, "%s params not currently supported.",
                           opcode.GetName());
    }
    // Multiple results without --enable-multi-value is checked above in
    // OnType.

    *out_param_types = func_type.params;
    *out_result_types = func_type.results;
  } else {
    out_param_types->clear();
    *out_result_types = sig_type.GetInlineVector();
  }

  return result;
}